

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvectorst.hpp
# Opt level: O2

void __thiscall
soplex::SPxVectorST<double>::setupWeights(SPxVectorST<double> *this,SPxSolverBase<double> *base)

{
  bool *pbVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  Item *pIVar7;
  Item *pIVar8;
  DataKey *pDVar9;
  Nonzero<double> *pNVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  if (this->state == DVEC) {
    pdVar2 = (this->vec).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar11 = (int)((ulong)((long)(this->vec).val.super__Vector_base<double,_std::allocator<double>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar2) >> 3);
    if ((base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
        thenum != iVar11) goto LAB_001fd0aa;
    pdVar3 = (this->super_SPxWeightST<double>).rowWeight.data.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    lVar12 = (long)iVar11;
    while (bVar15 = lVar12 != 0, lVar12 = lVar12 + -1, bVar15) {
      pdVar3[lVar12] = ABS(pdVar2[lVar12]) + pdVar3[lVar12];
    }
    lVar12 = (long)(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
    pIVar8 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
             theitem;
    pDVar9 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
             thekey;
    pdVar3 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar4 = (this->super_SPxWeightST<double>).colWeight.data.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    while (bVar15 = lVar12 != 0, lVar12 = lVar12 + -1, bVar15) {
      iVar11 = pDVar9[lVar12].idx;
      lVar13 = (long)pIVar8[iVar11].data.super_SVectorBase<double>.memused;
      lVar14 = lVar13 * 0x10 + -8;
      dVar16 = 0.0;
      dVar20 = 0.0;
      while (bVar15 = lVar13 != 0, lVar13 = lVar13 + -1, bVar15) {
        pNVar10 = pIVar8[iVar11].data.super_SVectorBase<double>.m_elem;
        dVar17 = *(double *)((long)pNVar10 + lVar14 + -8);
        dVar16 = dVar16 + dVar17 * pdVar2[*(int *)((long)&pNVar10->val + lVar14)];
        dVar20 = dVar20 + dVar17 * dVar17;
        lVar14 = lVar14 + -0x10;
      }
      if (0.0 < dVar20) {
        pdVar4[lVar12] = ABS(dVar16 / dVar20 - pdVar3[lVar12]) + pdVar4[lVar12];
      }
    }
  }
  else {
    if ((this->state != PVEC) ||
       ((base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
        thenum != (int)((ulong)((long)(this->vec).val.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)(this->vec).val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 3))) {
LAB_001fd0aa:
      SPxWeightST<double>::setupWeights(&this->super_SPxWeightST<double>,base);
      return;
    }
    dVar16 = SPxSolverBase<double>::epsilon(base);
    dVar20 = dVar16 * 10000.0;
    lVar12 = (long)(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
    pbVar1 = (this->super_SPxWeightST<double>).colUp.data;
    pdVar2 = (this->super_SPxWeightST<double>).colWeight.data.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar3 = (this->vec).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar5 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar6 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    for (lVar13 = 0; -lVar13 != lVar12; lVar13 = lVar13 + -1) {
      dVar17 = pdVar3[lVar12 + lVar13 + -1];
      dVar19 = pdVar5[lVar12 + lVar13 + -1] - dVar17;
      dVar17 = dVar17 - pdVar4[lVar12 + lVar13 + -1];
      if (dVar19 <= dVar17) {
        dVar18 = pdVar6[lVar12 + lVar13 + -1] * dVar20 - dVar19;
      }
      else {
        dVar18 = -dVar17 - pdVar6[lVar12 + lVar13 + -1] * dVar20;
      }
      pdVar2[lVar12 + lVar13 + -1] = dVar18;
      pbVar1[lVar13 + lVar12 + -1] = dVar19 <= dVar17;
    }
    lVar12 = (long)(base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
    while (lVar13 = lVar12 + -1, lVar12 != 0) {
      pIVar7 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               set.theitem;
      iVar11 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               set.thekey[lVar13].idx;
      pIVar8 = pIVar7 + iVar11;
      dVar17 = VectorBase<double>::operator*(&this->vec,(SVectorBase<double> *)pIVar8);
      dVar18 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar13] - dVar17;
      dVar17 = dVar17 - (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar13];
      iVar11 = pIVar7[iVar11].data.super_SVectorBase<double>.memused;
      dVar19 = VectorBase<double>::operator*
                         (&(base->super_SPxLPBase<double>).super_LPColSetBase<double>.object,
                          (SVectorBase<double> *)pIVar8);
      dVar21 = (double)iVar11 * dVar16;
      if (dVar18 <= dVar17) {
        dVar19 = dVar19 * dVar20 + (-dVar18 - dVar21);
      }
      else {
        dVar19 = (-dVar17 - dVar21) - dVar19 * dVar20;
      }
      (this->super_SPxWeightST<double>).rowWeight.data.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [lVar13] = dVar19;
      (this->super_SPxWeightST<double>).rowRight.data[lVar12 + -1] = dVar18 <= dVar17;
      lVar12 = lVar13;
    }
  }
  return;
}

Assistant:

void SPxVectorST<R>::setupWeights(SPxSolverBase<R>& base)
{
   if(state == PVEC)
   {
      if(vec.dim() != base.nCols())
      {
         SPxWeightST<R>::setupWeights(base);
         return;
      }

      const VectorBase<R>& obj = base.maxObj();
      R eps = base.epsilon();
      R bias = 10000 * eps;
      R x, y;
      int i;

      SPxOut::debug(this, "DVECST01 colWeight[]: ");

      for(i = base.nCols(); i--;)
      {
         x = vec[i] - base.SPxLPBase<R>::lower(i);
         y = base.SPxLPBase<R>::upper(i) - vec[i];

         if(x < y)
         {
            this->colWeight[i] = -x - bias * obj[i];
            this->colUp[i] = 0;
         }
         else
         {
            this->colWeight[i] = -y + bias * obj[i];
            this->colUp[i] = 1;
         }

         SPxOut::debug(this, "{} ", this->colWeight[i]);
      }

      SPxOut::debug(this, "\n \n");

      SPxOut::debug(this, "DVECST02 rowWeight[]: ");

      for(i = base.nRows(); i--;)
      {
         const SVectorBase<R>& row = base.rowVector(i);
         y = vec * row;
         x = (y - base.lhs(i));
         y = (base.rhs(i) - y);

         if(x < y)
         {
            this->rowWeight[i] = -x - eps * row.size() - bias * (obj * row);
            this->rowRight[i] = 0;
         }
         else
         {
            this->rowWeight[i] = -y - eps * row.size() + bias * (obj * row);
            this->rowRight[i] = 1;
         }

         SPxOut::debug(this, "{} ", this->rowWeight[i]);
      }

      SPxOut::debug(this, "\n");
   }

   else if(state == DVEC)
   {
      if(vec.dim() != base.nRows())
      {
         SPxWeightST<R>::setupWeights(base);
         return;
      }

      R x, y, len;
      int i, j;

      for(i = base.nRows(); i--;)
         this->rowWeight[i] += spxAbs(vec[i]);

      for(i = base.nCols(); i--;)
      {
         const SVectorBase<R>& col = base.colVector(i);

         for(y = len = 0, j = col.size(); j--;)
         {
            x = col.value(j);
            y += vec[col.index(j)] * x;
            len += x * x;
         }

         if(len > 0)
            this->colWeight[i] += spxAbs(y / len - base.maxObj(i));
      }
   }
   else
      SPxWeightST<R>::setupWeights(base);
}